

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O1

void mserialize::detail::
     BuiltinSerializer<std::tuple<int,std::vector<int,std::allocator<int>>,std::pair<short,short>,std::deque<char,std::allocator<char>>>,void>
     ::serialize_elems<OutputStream,0ul,1ul,2ul,3ul>
               (deque<char,_std::allocator<char>_> *t,OutputStream *ostream)

{
  undefined1 local_14 [4];
  
  std::ostream::write((char *)(ostream->stream + 0x10),(long)local_14);
  BuiltinSerializer<std::vector<int,_std::allocator<int>_>,_void>::serialize<OutputStream>
            ((vector<int,_std::allocator<int>_> *)
             &t[1].super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
              _M_map_size,ostream);
  BuiltinSerializer<std::pair<short,short>,void>::serialize_elems<OutputStream,0ul,1ul>
            (t + 1,ostream);
  BuiltinSerializer<std::deque<char,_std::allocator<char>_>,_void>::serialize<OutputStream>
            (t,ostream);
  return;
}

Assistant:

static void serialize_elems(const Tuple<E...>& t, OutputStream& ostream, std::index_sequence<I...>)
  {
    using swallow = int[];
    using std::get;
    (void)swallow{1, (mserialize::serialize(get<I>(t), ostream), int{})...};
  }